

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_dsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,DSA **dsa_ctx)

{
  DSA *key;
  int iVar1;
  EVP_PKEY *pkey;
  char *errmsg;
  DSA *dsa;
  uchar *priv_key;
  uchar *pub_key;
  uchar *g;
  uchar *q;
  uchar *p;
  size_t priv_len;
  size_t pub_len;
  size_t glen;
  size_t qlen;
  size_t plen;
  
  dsa = (DSA *)0x0;
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&p,&plen);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_bignum_bytes(decrypted,&q,&qlen);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes(decrypted,&g,&glen);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes(decrypted,&pub_key,&pub_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes(decrypted,&priv_key,&priv_len);
          if (iVar1 == 0) {
            _libssh2_dsa_new(&dsa,p,plen,q,qlen,g,glen,pub_key,pub_len,priv_key,priv_len);
            key = dsa;
            iVar1 = 0;
            if (((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) && (dsa != (DSA *)0x0))
            {
              pkey = EVP_PKEY_new();
              EVP_PKEY_set1_DSA(pkey,(dsa_st *)key);
              iVar1 = gen_publickey_from_dsa_evp
                                (session,method,method_len,pubkeydata,pubkeydata_len,
                                 (EVP_PKEY *)pkey);
              if (pkey != (EVP_PKEY *)0x0) {
                EVP_PKEY_free(pkey);
              }
            }
            if (dsa_ctx != (DSA **)0x0) {
              *dsa_ctx = key;
              return iVar1;
            }
            DSA_free((DSA *)key);
            return iVar1;
          }
          errmsg = "DSA no private key";
        }
        else {
          errmsg = "DSA no public key";
        }
      }
      else {
        errmsg = "DSA no g";
      }
    }
    else {
      errmsg = "DSA no q";
    }
  }
  else {
    errmsg = "DSA no p";
  }
  _libssh2_error(session,-0xe,errmsg);
  return -1;
}

Assistant:

static int
gen_publickey_from_dsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_dsa_ctx **dsa_ctx)
{
    int rc = 0;
    size_t plen, qlen, glen, pub_len, priv_len;
    unsigned char *p, *q, *g, *pub_key, *priv_key;
    DSA *dsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing DSA keys from private key data"));

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no q");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &g, &glen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no g");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &pub_key, &pub_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no public key");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &priv_key, &priv_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "DSA no private key");
        return -1;
    }

    rc = _libssh2_dsa_new(&dsa,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          g, (unsigned long)glen,
                          pub_key, (unsigned long)pub_len,
                          priv_key, (unsigned long)priv_len);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_ERROR_PROTO,
                       "Could not create DSA private key"));
        goto fail;
    }

    if(dsa && pubkeydata && method) {
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_DSA(pk, dsa);

        rc = gen_publickey_from_dsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

        if(pk)
            EVP_PKEY_free(pk);
    }

    if(dsa_ctx)
        *dsa_ctx = dsa;
    else
        DSA_free(dsa);

    return rc;

fail:

    if(dsa)
        DSA_free(dsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}